

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>::
vector<std::__cxx11::string_const*>
          (vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>> *this
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last,
          polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *alloc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  
  *(memory_resource **)this = alloc->memoryResource;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this,(long)last - (long)first >> 5);
  for (lVar2 = 0;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(first->_M_dataplus)._M_p + lVar2), pbVar1 != last; lVar2 = lVar2 + 0x20) {
    std::__cxx11::string::string((string *)(*(long *)(this + 8) + lVar2),(string *)pbVar1);
  }
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }